

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void AssignFuncSymRegister
               (ParseNodeFnc *pnodeFnc,ByteCodeGenerator *byteCodeGenerator,FuncInfo *callee)

{
  Symbol *this;
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  Scope *pSVar5;
  FuncInfo *pFVar6;
  FuncInfo *pFVar7;
  Symbol *this_00;
  Symbol *functionScopeVarSym;
  Symbol *sym;
  FuncInfo *callee_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodeFnc *pnodeFnc_local;
  
  if (pnodeFnc->pnodeName != (ParseNodeVar *)0x0) {
    if ((pnodeFnc->pnodeName->super_ParseNode).nop != knopVarDecl) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0xa40,"(pnodeFnc->pnodeName->nop == knopVarDecl)",
                         "pnodeFnc->pnodeName->nop == knopVarDecl");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this = pnodeFnc->pnodeName->sym;
    if (this != (Symbol *)0x0) {
      bVar2 = Symbol::GetIsGlobal(this);
      if ((bVar2) ||
         ((callee->funcExprScope != (Scope *)0x0 &&
          (bVar2 = Scope::GetIsObject(callee->funcExprScope), bVar2)))) {
        bVar2 = ParseNodeFnc::IsDeclaration(pnodeFnc);
        if ((!bVar2) && (RVar3 = Symbol::GetLocation(this), RVar3 == 0xffffffff)) {
          RVar3 = FuncInfo::NextVarRegister(callee);
          Symbol::SetLocation(this,RVar3);
        }
      }
      else {
        bVar2 = ParseNodeFnc::IsDeclaration(pnodeFnc);
        if (bVar2) {
          ByteCodeGenerator::AssignRegister(byteCodeGenerator,this);
          RVar3 = Symbol::GetLocation(this);
          (pnodeFnc->super_ParseNode).location = RVar3;
          pSVar5 = ByteCodeGenerator::GetCurrentScope(byteCodeGenerator);
          pFVar6 = Scope::GetFunc(pSVar5);
          pSVar5 = Symbol::GetScope(this);
          pFVar7 = Scope::GetFunc(pSVar5);
          if (pFVar6 != pFVar7) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                               ,0xa61,
                               "(byteCodeGenerator->GetCurrentScope()->GetFunc() == sym->GetScope()->GetFunc())"
                               ,
                               "byteCodeGenerator->GetCurrentScope()->GetFunc() == sym->GetScope()->GetFunc()"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
          pSVar5 = ByteCodeGenerator::GetCurrentScope(byteCodeGenerator);
          pFVar6 = Scope::GetFunc(pSVar5);
          pSVar5 = Symbol::GetScope(this);
          pFVar7 = Scope::GetFunc(pSVar5);
          if (pFVar6 != pFVar7) {
            pSVar5 = ByteCodeGenerator::GetCurrentScope(byteCodeGenerator);
            pFVar6 = Scope::GetFunc(pSVar5);
            pFVar6 = ByteCodeGenerator::GetParentFuncInfo(pFVar6);
            pSVar5 = Symbol::GetScope(this);
            pFVar7 = Scope::GetFunc(pSVar5);
            if (pFVar6 != pFVar7) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                 ,0xa64,
                                 "(ByteCodeGenerator::GetParentFuncInfo(byteCodeGenerator->GetCurrentScope()->GetFunc()) == sym->GetScope()->GetFunc())"
                                 ,
                                 "ByteCodeGenerator::GetParentFuncInfo(byteCodeGenerator->GetCurrentScope()->GetFunc()) == sym->GetScope()->GetFunc()"
                                );
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 0;
            }
            pSVar5 = Symbol::GetScope(this);
            Scope::SetMustInstantiate(pSVar5,true);
            ByteCodeGenerator::ProcessCapturedSym(byteCodeGenerator,this);
            pSVar5 = Symbol::GetScope(this);
            pFVar6 = Scope::GetFunc(pSVar5);
            FuncInfo::SetHasLocalInClosure(pFVar6,true);
          }
          this_00 = Symbol::GetFuncScopeVarSym(this);
          if ((this_00 != (Symbol *)0x0) && (bVar2 = Symbol::GetIsGlobal(this_00), !bVar2)) {
            pSVar5 = Symbol::GetScope(this);
            pFVar6 = Scope::GetFunc(pSVar5);
            bVar2 = Symbol::IsInSlot(this_00,byteCodeGenerator,pFVar6,false);
            if (!bVar2) {
              ByteCodeGenerator::AssignRegister(byteCodeGenerator,this_00);
            }
          }
        }
        else {
          bVar2 = FuncInfo::GetFuncExprNameReference(callee);
          if ((bVar2) && (RVar3 = Symbol::GetLocation(this), RVar3 == 0xffffffff)) {
            RVar3 = FuncInfo::NextVarRegister(callee);
            Symbol::SetLocation(this,RVar3);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void AssignFuncSymRegister(ParseNodeFnc * pnodeFnc, ByteCodeGenerator * byteCodeGenerator, FuncInfo * callee)
{
    // register to hold the allocated function (in enclosing sequence of global statements)
    // TODO: Make the parser identify uses of function decls as RHS's of expressions.
    // Currently they're all marked as used, so they all get permanent (non-temp) registers.
    if (pnodeFnc->pnodeName == nullptr)
    {
        return;
    }
    Assert(pnodeFnc->pnodeName->nop == knopVarDecl);
    Symbol *sym = pnodeFnc->pnodeName->sym;
    if (sym)
    {
        if (!sym->GetIsGlobal() && !(callee->funcExprScope && callee->funcExprScope->GetIsObject()))
        {
            // If the func decl is used, we have to give the expression a register to protect against:
            // x.x = function f() {...};
            // x.y = function f() {...};
            // If we let the value reside in the local slot for f, then both assignments will get the
            // second definition.
            if (!pnodeFnc->IsDeclaration())
            {
                // A named function expression's name belongs to the enclosing scope.
                // In ES5 mode, it is visible only inside the inner function.
                // Allocate a register for the 'name' symbol from an appropriate register namespace.
                if (callee->GetFuncExprNameReference())
                {
                    // This is a function expression with a name, but probably doesn't have a use within
                    // the function. If that is the case then allocate a register for LdFuncExpr inside the function
                    // we just finished post-visiting.
                    if (sym->GetLocation() == Js::Constants::NoRegister)
                    {
                        sym->SetLocation(callee->NextVarRegister());
                    }
                }
            }
            else
            {
                // Function declaration
                byteCodeGenerator->AssignRegister(sym);
                pnodeFnc->location = sym->GetLocation();

                Assert(byteCodeGenerator->GetCurrentScope()->GetFunc() == sym->GetScope()->GetFunc());
                if (byteCodeGenerator->GetCurrentScope()->GetFunc() != sym->GetScope()->GetFunc())
                {
                    Assert(ByteCodeGenerator::GetParentFuncInfo(byteCodeGenerator->GetCurrentScope()->GetFunc()) == sym->GetScope()->GetFunc());
                    sym->GetScope()->SetMustInstantiate(true);
                    byteCodeGenerator->ProcessCapturedSym(sym);
                    sym->GetScope()->GetFunc()->SetHasLocalInClosure(true);
                }

                Symbol * functionScopeVarSym = sym->GetFuncScopeVarSym();
                if (functionScopeVarSym &&
                    !functionScopeVarSym->GetIsGlobal() &&
                    !functionScopeVarSym->IsInSlot(byteCodeGenerator, sym->GetScope()->GetFunc()))
                {
                    byteCodeGenerator->AssignRegister(functionScopeVarSym);
                }
            }
        }
        else if (!pnodeFnc->IsDeclaration())
        {
            if (sym->GetLocation() == Js::Constants::NoRegister)
            {
                // Here, we are assigning a register for the LdFuncExpr instruction inside the function we just finished
                // post-visiting. The symbol is given a register from the register pool for the function we just finished
                // post-visiting, rather than from the parent function's register pool.
                sym->SetLocation(callee->NextVarRegister());
            }
        }
    }
}